

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdlib.cpp
# Opt level: O0

FString ExtractFileBase(char *path,bool include_extension)

{
  bool bVar1;
  size_t sVar2;
  byte in_DL;
  undefined7 in_register_00000031;
  char *__s;
  byte local_49;
  char *local_30;
  char *dot;
  char *src;
  bool include_extension_local;
  char *path_local;
  
  __s = (char *)CONCAT71(in_register_00000031,include_extension);
  sVar2 = strlen(__s);
  dot = __s + (sVar2 - 1);
  if (dot < __s) {
    FString::FString((FString *)path);
  }
  else {
    while( true ) {
      local_49 = 0;
      if (dot != __s) {
        bVar1 = IsSeperator((int)dot[-1]);
        local_49 = bVar1 ^ 0xff;
      }
      if ((local_49 & 1) == 0) break;
      dot = dot + -1;
    }
    if ((in_DL & 1) == 0) {
      local_30 = dot;
      while( true ) {
        bVar1 = false;
        if (*local_30 != '\0') {
          bVar1 = *local_30 != '.';
        }
        if (!bVar1) break;
        local_30 = local_30 + 1;
      }
      FString::FString((FString *)path,dot,(long)local_30 - (long)dot);
    }
    else {
      FString::FString((FString *)path,dot);
    }
  }
  return (FString)path;
}

Assistant:

FString ExtractFileBase (const char *path, bool include_extension)
{
	const char *src, *dot;

	src = path + strlen(path) - 1;

	if (src >= path)
	{
		// back up until a / or the start
		while (src != path && !IsSeperator(*(src-1)))
			src--;

		// Check for files with drive specification but no path
#if defined(_WIN32) || defined(DOS)
		if (src == path && src[0] != 0)
		{
			if (src[1] == ':')
				src += 2;
		}
#endif

		if (!include_extension)
		{
			dot = src;
			while (*dot && *dot != '.')
			{
				dot++;
			}
			return FString(src, dot - src);
		}
		else
		{
			return FString(src);
		}
	}
	return FString();
}